

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

bool chaiscript::AST_Node::get_bool_condition(Boxed_Value *t_bv,Dispatch_State *t_ss)

{
  bool bVar1;
  
  bVar1 = detail::Dispatch_Engine::boxed_cast<bool>((t_ss->m_engine)._M_data,t_bv);
  return bVar1;
}

Assistant:

bool AST_Node::get_bool_condition(const Boxed_Value &t_bv, const chaiscript::detail::Dispatch_State &t_ss) {
      try {
        return t_ss->boxed_cast<bool>(t_bv);
      } catch (const exception::bad_boxed_cast &) {
        throw exception::eval_error("Condition not boolean");
      }
  }